

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void lowbd_fwd_txfm2d_16x8_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  uint uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  bool bVar19;
  int8_t *piVar20;
  long lVar21;
  undefined7 in_register_00000009;
  int bit;
  __m128i *out;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  __m128i buf0 [16];
  __m128i buf1 [16];
  __m256i buf2 [8];
  __m128i local_360;
  undefined1 auStack_350 [16];
  undefined1 local_340 [16];
  undefined1 auStack_330 [16];
  undefined1 local_320 [16];
  undefined1 auStack_310 [16];
  undefined1 local_300 [16];
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  longlong local_2e0;
  longlong lStack_2d8;
  undefined1 auStack_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 auStack_290 [16];
  undefined1 local_280 [16];
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  __m256i local_160;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  piVar20 = av1_fwd_txfm_shift_ls[8];
  uVar16 = (uint)CONCAT71(in_register_00000009,tx_type);
  pcVar1 = *(code **)((long)col_txfm16x8_arr + (ulong)(uVar16 * 8));
  pcVar2 = *(code **)((long)row_txfm16x8_arr + (ulong)(uVar16 * 8));
  bVar19 = false;
  if (uVar16 < 0x10) {
    if ((0x4110U >> (uVar16 & 0x1f) & 1) != 0) {
      bVar19 = false;
LAB_003cefb5:
      load_buffer_16bit_to_16bit_flip(input,stride,&local_360,8);
      load_buffer_16bit_to_16bit_flip(input + 8,stride,(__m128i *)&local_2e0,8);
      goto LAB_003cefe6;
    }
    if ((0x80a0U >> (uVar16 & 0x1f) & 1) == 0) {
      if (uVar16 == 6) {
        bVar19 = true;
        goto LAB_003cefb5;
      }
    }
    else {
      bVar19 = true;
    }
  }
  load_buffer_16bit_to_16bit(input,stride,&local_360,8);
  load_buffer_16bit_to_16bit(input + 8,stride,(__m128i *)&local_2e0,8);
LAB_003cefe6:
  auVar4._16_16_ = auStack_350;
  auVar4._0_8_ = local_360[0];
  auVar4._8_8_ = local_360[1];
  auVar5._16_16_ = local_340;
  auVar5._0_16_ = auStack_350;
  auVar6._16_16_ = auStack_330;
  auVar6._0_16_ = local_340;
  auVar7._16_16_ = local_320;
  auVar7._0_16_ = auStack_330;
  auVar11._8_8_ = lStack_2d8;
  auVar11._0_8_ = local_2e0;
  auVar11._16_16_ = auStack_2d0;
  local_160 = (__m256i)vperm2f128_avx(auVar4,auVar11,0x20);
  auVar12._16_16_ = local_2c0;
  auVar12._0_16_ = auStack_2d0;
  local_140 = vperm2f128_avx(auVar5,auVar12,0x20);
  auVar13._16_16_ = auStack_2b0;
  auVar13._0_16_ = local_2c0;
  local_120 = vperm2f128_avx(auVar6,auVar13,0x20);
  auVar14._16_16_ = local_2a0;
  auVar14._0_16_ = auStack_2b0;
  local_100 = vperm2f128_avx(auVar7,auVar14,0x20);
  auVar8._16_16_ = auStack_310;
  auVar8._0_16_ = local_320;
  auVar15._16_16_ = auStack_290;
  auVar15._0_16_ = local_2a0;
  local_e0 = vperm2f128_avx(auVar8,auVar15,0x20);
  auVar9._16_16_ = local_300;
  auVar9._0_16_ = auStack_310;
  auVar17._16_16_ = local_280;
  auVar17._0_16_ = auStack_290;
  local_c0 = vperm2f128_avx(auVar9,auVar17,0x20);
  auVar10._16_8_ = uStack_2f0;
  auVar10._0_16_ = local_300;
  auVar10._24_8_ = uStack_2e8;
  auVar18._16_8_ = uStack_270;
  auVar18._0_16_ = local_280;
  auVar18._24_8_ = uStack_268;
  local_a0 = vperm2f128_avx(auVar10,auVar18,0x20);
  local_80._8_8_ = uStack_2e8;
  local_80._0_8_ = uStack_2f0;
  local_80._16_8_ = uStack_270;
  local_80._24_8_ = uStack_268;
  round_shift_16bit_w16_avx2(&local_160,8,(int)*piVar20);
  (*pcVar1)(&local_160,&local_160,0xd);
  round_shift_16bit_w16_avx2(&local_160,8,(int)piVar20[1]);
  auVar8 = vpunpcklwd_avx2((undefined1  [32])local_160,local_140);
  auVar9 = vpunpcklwd_avx2(local_120,local_100);
  auVar10 = vpunpcklwd_avx2(local_e0,local_c0);
  auVar11 = vpunpcklwd_avx2(local_a0,local_80);
  auVar4 = vpunpckhwd_avx2((undefined1  [32])local_160,local_140);
  auVar5 = vpunpckhwd_avx2(local_120,local_100);
  auVar6 = vpunpckhwd_avx2(local_e0,local_c0);
  auVar7 = vpunpckhwd_avx2(local_a0,local_80);
  auVar12 = vpunpckldq_avx2(auVar8,auVar9);
  auVar13 = vpunpckldq_avx2(auVar10,auVar11);
  auVar14 = vpunpckldq_avx2(auVar4,auVar5);
  auVar15 = vpunpckldq_avx2(auVar6,auVar7);
  auVar8 = vpunpckhdq_avx2(auVar8,auVar9);
  auVar9 = vpunpckhdq_avx2(auVar10,auVar11);
  auVar4 = vpunpckhdq_avx2(auVar4,auVar5);
  auVar5 = vpunpckhdq_avx2(auVar6,auVar7);
  local_160 = (__m256i)vpunpcklqdq_avx2(auVar12,auVar13);
  local_140 = vpunpckhqdq_avx2(auVar12,auVar13);
  local_120 = vpunpcklqdq_avx2(auVar8,auVar9);
  local_100 = vpunpckhqdq_avx2(auVar8,auVar9);
  local_e0 = vpunpcklqdq_avx2(auVar14,auVar15);
  local_c0 = vpunpckhqdq_avx2(auVar14,auVar15);
  local_a0 = vpunpcklqdq_avx2(auVar4,auVar5);
  local_80 = vpunpckhqdq_avx2(auVar4,auVar5);
  local_260._0_16_ = ZEXT116(0) * local_140._0_16_ + ZEXT116(1) * local_160._0_16_;
  local_260._16_16_ = ZEXT116(0) * local_160._16_16_ + ZEXT116(1) * local_140._0_16_;
  local_240._0_16_ = ZEXT116(0) * local_100._0_16_ + ZEXT116(1) * local_120._0_16_;
  local_240._16_16_ = ZEXT116(0) * local_120._16_16_ + ZEXT116(1) * local_100._0_16_;
  local_220._0_16_ = ZEXT116(0) * local_c0._0_16_ + ZEXT116(1) * local_e0._0_16_;
  local_220._16_16_ = ZEXT116(0) * local_e0._16_16_ + ZEXT116(1) * local_c0._0_16_;
  local_200._0_16_ = ZEXT116(0) * local_80._0_16_ + ZEXT116(1) * local_a0._0_16_;
  local_200._16_16_ = ZEXT116(0) * local_a0._16_16_ + ZEXT116(1) * local_80._0_16_;
  local_1e0 = vperm2i128_avx2((undefined1  [32])local_160,local_140,0x31);
  local_1c0 = vperm2i128_avx2(local_120,local_100,0x31);
  local_1a0 = vperm2i128_avx2(local_e0,local_c0,0x31);
  local_180 = vperm2i128_avx2(local_a0,local_80,0x31);
  if (bVar19) {
    out = &local_360;
    flip_buf_sse2((__m128i *)local_260,out,0x10);
  }
  else {
    out = (__m128i *)local_260;
  }
  (*pcVar2)(out,out,0xd);
  round_shift_16bit(out,(int)piVar20[2],bit);
  auVar22._8_2_ = 1;
  auVar22._0_8_ = 0x1000100010001;
  auVar22._10_2_ = 1;
  auVar22._12_2_ = 1;
  auVar22._14_2_ = 1;
  auVar23._8_4_ = 0x80016a1;
  auVar23._0_8_ = 0x80016a1080016a1;
  auVar23._12_4_ = 0x80016a1;
  for (lVar21 = 0; lVar21 != 0x100; lVar21 = lVar21 + 0x10) {
    auVar24 = *(undefined1 (*) [16])((long)*out + lVar21);
    auVar25 = vpunpcklwd_avx(auVar24,auVar22);
    auVar3 = vpunpckhwd_avx(auVar24,auVar22);
    auVar24 = vpmaddwd_avx(auVar25,auVar23);
    auVar25 = vpsrad_avx(auVar24,0xc);
    auVar24 = vpmaddwd_avx(auVar3,auVar23);
    auVar24 = vpsrad_avx(auVar24,0xc);
    *(undefined1 (*) [16])((long)output + lVar21 * 2) = auVar25;
    *(undefined1 (*) [16])((long)output + lVar21 * 2 + 0x10) = auVar24;
  }
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_16x8_avx2(const int16_t *input, int32_t *output,
                                       int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  __m256i buf2[8];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X8];
  const int txw_idx = get_txw_idx(TX_16X8);
  const int txh_idx = get_txh_idx(TX_16X8);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 16;
  const int height = 8;
  const transform_1d_avx2 col_txfm = col_txfm16x8_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm16x8_arr[tx_type];
  __m128i *buf;
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip(input + 8 * 0, stride, buf0, height);
    load_buffer_16bit_to_16bit_flip(input + 8 * 1, stride, &buf0[8], height);
  } else {
    load_buffer_16bit_to_16bit(input + 8 * 0, stride, buf0, height);
    load_buffer_16bit_to_16bit(input + 8 * 1, stride, &buf0[8], height);
  }
  pack_reg(buf0, &buf0[8], buf2);
  round_shift_16bit_w16_avx2(buf2, height, shift[0]);
  col_txfm(buf2, buf2, cos_bit_col);
  round_shift_16bit_w16_avx2(buf2, height, shift[1]);
  transpose_16bit_16x8_avx2(buf2, buf2);
  extract_reg(buf2, buf1);

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w8(buf, output, height, width);
}